

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.h
# Opt level: O3

ostream * __thiscall Measure<int>::Print(Measure<int> *this,ostream *out)

{
  source_loc loc;
  logger *this_00;
  long local_48;
  basic_string_view<char> local_40;
  
  local_48 = (this->time).__d.__r / 1000000000;
  this_00 = spdlog::default_logger_raw();
  local_40.data_ = "name: {}, type: {}, time: {}, value: {}";
  local_40.size_ = 0x27;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  spdlog::logger::
  log_<fmt::v6::basic_string_view<char>,std::__cxx11::string,MetricTypes::MetricType,long,int>
            (this_00,loc,info,&local_40,&this->name,&this->type,&local_48,&this->value);
  PrintTags(this);
  return out;
}

Assistant:

std::ostream& Print(std::ostream& out) const  {
        spdlog::info("name: {}, type: {}, time: {}, value: {}", this->name, this->type, system_clock::to_time_t(this->time), this->value);
        PrintTags();
        return out;
    }